

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteBlif.c
# Opt level: O0

void Bac_ManWriteBlifArray(FILE *pFile,Bac_Ntk_t *p,Vec_Int_t *vFanins,int iObj)

{
  int iVar1;
  char *pcVar2;
  int local_2c;
  int i;
  int iFanin;
  int iObj_local;
  Vec_Int_t *vFanins_local;
  Bac_Ntk_t *p_local;
  FILE *pFile_local;
  
  for (local_2c = 0; iVar1 = Vec_IntSize(vFanins), local_2c < iVar1; local_2c = local_2c + 1) {
    iVar1 = Vec_IntEntry(vFanins,local_2c);
    pcVar2 = Bac_ObjNameStr(p,iVar1);
    fprintf((FILE *)pFile," %s",pcVar2);
  }
  if (-1 < iObj) {
    pcVar2 = Bac_ObjNameStr(p,iObj);
    fprintf((FILE *)pFile," %s",pcVar2);
  }
  fprintf((FILE *)pFile,"\n");
  return;
}

Assistant:

void Bac_ManWriteBlifArray( FILE * pFile, Bac_Ntk_t * p, Vec_Int_t * vFanins, int iObj )
{
    int iFanin, i;
    Vec_IntForEachEntry( vFanins, iFanin, i )
        fprintf( pFile, " %s", Bac_ObjNameStr(p, iFanin) );
    if ( iObj >= 0 )
        fprintf( pFile, " %s", Bac_ObjNameStr(p, iObj) );
    fprintf( pFile, "\n" );
}